

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void PBKDF2_SHA256(uint8_t *passwd,size_t passwdlen,uint8_t *salt,size_t saltlen,uint64_t c,
                  uint8_t *buf,size_t dkLen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  uint8_t ivec [4];
  uint8_t T [32];
  uint8_t U [32];
  HMAC_SHA256_CTX_Y PShctx;
  HMAC_SHA256_CTX_Y hctx;
  uint local_234;
  uint8_t *local_230;
  long local_228;
  uint8_t *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  HMAC_SHA256_CTX_Y local_1d0;
  HMAC_SHA256_CTX_Y local_100;
  
  local_230 = buf;
  local_220 = passwd;
  HMAC_SHA256_Init_Y(&local_1d0,passwd,passwdlen);
  SHA256_Update_Y(&local_1d0.ictx,salt,saltlen);
  if (dkLen != 0) {
    uVar7 = 0;
    local_228 = 0;
    do {
      local_228 = local_228 + 1;
      uVar5 = (uint)local_228;
      local_234 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      memcpy(&local_100,&local_1d0,0xd0);
      SHA256_Update_Y(&local_100.ictx,&local_234,4);
      HMAC_SHA256_Final_Y((uchar *)&local_1f8,&local_100);
      local_208 = local_1e8;
      uStack_200 = uStack_1e0;
      local_218 = local_1f8;
      uStack_210 = uStack_1f0;
      if (1 < c) {
        uVar8 = 2;
        do {
          HMAC_SHA256_Init_Y(&local_100,local_220,passwdlen);
          SHA256_Update_Y(&local_100.ictx,&local_1f8,0x20);
          HMAC_SHA256_Final_Y((uchar *)&local_1f8,&local_100);
          lVar6 = 0;
          do {
            uVar5 = *(uint *)((long)&uStack_210 + lVar6);
            uVar1 = *(uint *)((long)&uStack_210 + lVar6 + 4);
            uVar2 = *(uint *)((long)&local_1f8 + lVar6 + 4);
            uVar3 = *(uint *)((long)&uStack_1f0 + lVar6);
            uVar4 = *(uint *)((long)&uStack_1f0 + lVar6 + 4);
            *(uint *)((long)&local_218 + lVar6) =
                 *(uint *)((long)&local_218 + lVar6) ^ *(uint *)((long)&local_1f8 + lVar6);
            *(uint *)((long)&local_218 + lVar6 + 4) =
                 *(uint *)((long)&local_218 + lVar6 + 4) ^ uVar2;
            *(uint *)((long)&uStack_210 + lVar6) = uVar5 ^ uVar3;
            *(uint *)((long)&uStack_210 + lVar6 + 4) = uVar1 ^ uVar4;
            lVar6 = lVar6 + 0x10;
          } while (lVar6 != 0x20);
          uVar8 = uVar8 + 1;
        } while (uVar8 <= c);
      }
      __n = dkLen - uVar7;
      if (0x1f < __n) {
        __n = 0x20;
      }
      memcpy(local_230 + uVar7,&local_218,__n);
      uVar7 = local_228 << 5;
    } while (uVar7 < dkLen);
  }
  memset(&local_1d0,0,0xd0);
  return;
}

Assistant:

void
PBKDF2_SHA256(const uint8_t * passwd, size_t passwdlen, const uint8_t * salt,
    size_t saltlen, uint64_t c, uint8_t * buf, size_t dkLen)
{
	HMAC_SHA256_CTX_Y PShctx, hctx;
	size_t i;
	uint8_t ivec[4];
	uint8_t U[32];
	uint8_t T[32];
	uint64_t j;
	int k;
	size_t clen;

	/* Compute HMAC state after processing P and S. */
	HMAC_SHA256_Init_Y(&PShctx, passwd, passwdlen);
	HMAC_SHA256_Update_Y(&PShctx, salt, saltlen);

	/* Iterate through the blocks. */
	for (i = 0; i * 32 < dkLen; i++) {
		/* Generate INT(i + 1). */
		be32enc(ivec, (uint32_t)(i + 1));

		/* Compute U_1 = PRF(P, S || INT(i)). */
		memcpy(&hctx, &PShctx, sizeof(HMAC_SHA256_CTX_Y));
		HMAC_SHA256_Update_Y(&hctx, ivec, 4);
		HMAC_SHA256_Final_Y(U, &hctx);

		/* T_i = U_1 ... */
		memcpy(T, U, 32);

		for (j = 2; j <= c; j++) {
			/* Compute U_j. */
			HMAC_SHA256_Init_Y(&hctx, passwd, passwdlen);
			HMAC_SHA256_Update_Y(&hctx, U, 32);
			HMAC_SHA256_Final_Y(U, &hctx);

			/* ... xor U_j ... */
			for (k = 0; k < 32; k++)
				T[k] ^= U[k];
		}

		/* Copy as many bytes as necessary into buf. */
		clen = dkLen - i * 32;
		if (clen > 32)
			clen = 32;
		memcpy(&buf[i * 32], T, clen);
	}

	/* Clean PShctx, since we never called _Final on it. */
	memset(&PShctx, 0, sizeof(HMAC_SHA256_CTX_Y));
}